

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.cpp
# Opt level: O2

void __thiscall
Book::Book(Book *this,Genre genre,string *isbn,string *title,string *author,Date *copyright_date,
          bool is_checked_out)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  regex regex;
  
  this->genre = genre;
  std::__cxx11::string::string((string *)&this->isbn,(string *)isbn);
  std::__cxx11::string::string((string *)&this->title,(string *)title);
  std::__cxx11::string::string((string *)&this->author,(string *)author);
  (this->copyright_date).days = copyright_date->days;
  this->is_chkd_out = is_checked_out;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&regex,"\\d+-\\d+-\\d+-(\\w|\\d+)",0x10);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (isbn,&regex,0);
  if (!bVar1) {
    std::operator+(&local_90,"\'",isbn);
    std::operator+(&local_70,&local_90,"\' is not a correct ISBN.");
    error(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&regex);
  return;
}

Assistant:

Book::Book(
	Genre genre,
	const std::string& isbn,
	const std::string& title,
	const std::string& author,
	const Date& copyright_date,
	bool is_checked_out
) : genre{ genre },
isbn{ isbn },
title{ title },
author{ author },
copyright_date{ copyright_date },
is_chkd_out{ is_checked_out }
{
	std::regex regex{ R"(\d+-\d+-\d+-(\w|\d+))" };
	if (!std::regex_match(isbn, regex))
		error("'" + isbn + "' is not a correct ISBN.");
}